

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_e304c3::AV1ConvolveParametersTest_GetCompoundParams_Test::TestBody
          (AV1ConvolveParametersTest_GetCompoundParams_Test *this)

{
  bool bVar1;
  reference pvVar2;
  AssertionResult *pAVar3;
  AssertionResult gtest_ar__1;
  size_t i;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  vector<(anonymous_namespace)::CompoundParam,_std::allocator<(anonymous_namespace)::CompoundParam>_>
  v;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedf;
  AssertionResult *in_stack_fffffffffffffee0;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  vector<(anonymous_namespace)::CompoundParam,_std::allocator<(anonymous_namespace)::CompoundParam>_>
  *in_stack_fffffffffffffef0;
  vector<(anonymous_namespace)::CompoundParam,_std::allocator<(anonymous_namespace)::CompoundParam>_>
  *this_00;
  char *in_stack_ffffffffffffff00;
  Type in_stack_ffffffffffffff0c;
  AssertHelper *in_stack_ffffffffffffff10;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  AssertionResult *this_01;
  AssertionResult *actual_predicate_value;
  char *in_stack_ffffffffffffff50;
  AssertionResult *in_stack_ffffffffffffff58;
  AssertHelper *in_stack_ffffffffffffff60;
  AssertionResult local_78;
  uint local_64;
  size_type local_40;
  undefined4 local_34;
  AssertionResult local_30;
  vector<(anonymous_namespace)::CompoundParam,_std::allocator<(anonymous_namespace)::CompoundParam>_>
  local_20;
  
  this_00 = &local_20;
  GetCompoundParams();
  local_34 = 9;
  local_40 = std::
             vector<(anonymous_namespace)::CompoundParam,_std::allocator<(anonymous_namespace)::CompoundParam>_>
             ::size(this_00);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)this_00,(char *)in_stack_fffffffffffffef0,
             (uint *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8),
             (unsigned_long *)in_stack_fffffffffffffee0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_30);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff10);
    in_stack_fffffffffffffef0 =
         (vector<(anonymous_namespace)::CompoundParam,_std::allocator<(anonymous_namespace)::CompoundParam>_>
          *)testing::AssertionResult::failure_message((AssertionResult *)0x972ad8);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,in_stack_ffffffffffffff00,
               (int)((ulong)this_00 >> 0x20),(char *)in_stack_fffffffffffffef0);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff60,(Message *)in_stack_ffffffffffffff58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffee0);
    testing::Message::~Message((Message *)0x972b35);
  }
  local_64 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x972bbc);
  if (local_64 == 0) {
    pvVar2 = std::
             vector<(anonymous_namespace)::CompoundParam,_std::allocator<(anonymous_namespace)::CompoundParam>_>
             ::operator[](&local_20,0);
    CompoundParam::UseDistWtdCompAvg(pvVar2);
    testing::AssertionResult::AssertionResult<bool>
              (in_stack_fffffffffffffee0,
               (bool *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8),
               (type *)0x972c14);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_78);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_ffffffffffffff10);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                 (char *)in_stack_ffffffffffffff40._M_head_impl);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,in_stack_ffffffffffffff00,
                 (int)((ulong)this_00 >> 0x20),(char *)in_stack_fffffffffffffef0);
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffff60,(Message *)in_stack_ffffffffffffff58);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffee0);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff50);
      testing::Message::~Message((Message *)0x972ce0);
    }
    local_64 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x972d8a);
    if (local_64 == 0) {
      this_01 = (AssertionResult *)0x1;
      while (actual_predicate_value = this_01,
            pAVar3 = (AssertionResult *)
                     std::
                     vector<(anonymous_namespace)::CompoundParam,_std::allocator<(anonymous_namespace)::CompoundParam>_>
                     ::size(&local_20), this_01 < pAVar3) {
        pvVar2 = std::
                 vector<(anonymous_namespace)::CompoundParam,_std::allocator<(anonymous_namespace)::CompoundParam>_>
                 ::operator[](&local_20,(size_type)actual_predicate_value);
        bVar1 = CompoundParam::UseDistWtdCompAvg(pvVar2);
        testing::AssertionResult::AssertionResult<bool>
                  (this_01,(bool *)CONCAT17(bVar1,in_stack_fffffffffffffed8),(type *)0x972e09);
        bVar1 = testing::AssertionResult::operator_cast_to_bool
                          ((AssertionResult *)&stack0xffffffffffffff38);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_ffffffffffffff10);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                     &actual_predicate_value->success_,
                     (char *)in_stack_ffffffffffffff40._M_head_impl);
          std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,in_stack_ffffffffffffff00,
                     (int)((ulong)this_00 >> 0x20),(char *)in_stack_fffffffffffffef0);
          testing::internal::AssertHelper::operator=
                    (in_stack_ffffffffffffff60,(Message *)in_stack_ffffffffffffff58);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
          std::__cxx11::string::~string((string *)&stack0xffffffffffffff00);
          testing::Message::~Message((Message *)0x972ebd);
        }
        local_64 = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x972f5b);
        if (local_64 != 0) goto LAB_00972f94;
        this_01 = (AssertionResult *)&actual_predicate_value->field_0x1;
      }
      local_64 = 0;
    }
  }
LAB_00972f94:
  std::
  vector<(anonymous_namespace)::CompoundParam,_std::allocator<(anonymous_namespace)::CompoundParam>_>
  ::~vector(in_stack_fffffffffffffef0);
  return;
}

Assistant:

TEST_F(AV1ConvolveParametersTest, GetCompoundParams) {
  auto v = GetCompoundParams();
  ASSERT_EQ(9U, v.size());
  ASSERT_FALSE(v[0].UseDistWtdCompAvg());
  for (size_t i = 1; i < v.size(); ++i) {
    ASSERT_TRUE(v[i].UseDistWtdCompAvg());
  }
}